

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O3

MXFSReader * __thiscall
ASDCP::JP2K::MXFSReader::ReadFrame
          (MXFSReader *this,ui32_t FrameNum,StereoscopicPhase_t phase,FrameBuffer *FrameBuf,
          AESDecContext *Ctx,HMACContext *HMAC)

{
  long lVar1;
  char cVar2;
  undefined4 in_register_00000034;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,FrameNum) + 8);
  if (lVar1 != 0) {
    cVar2 = (**(code **)(**(long **)(lVar1 + 0x10) + 0x40))();
    if (cVar2 != '\0') {
      h__SReader::ReadFrame
                ((h__SReader *)this,
                 (ui32_t)*(undefined8 *)(CONCAT44(in_register_00000034,FrameNum) + 8),phase,
                 (FrameBuffer *)((ulong)FrameBuf & 0xffffffff),Ctx,HMAC);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::JP2K::MXFSReader::ReadFrame(ui32_t FrameNum, StereoscopicPhase_t phase, FrameBuffer& FrameBuf,
				   AESDecContext* Ctx, HMACContext* HMAC) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    return m_Reader->ReadFrame(FrameNum, phase, FrameBuf, Ctx, HMAC);

  return RESULT_INIT;
}